

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::Binder::GetMatchingBinding
          (Binder *this,string *catalog_name,string *schema_name,string *table_name,
          string *column_name,ErrorData *error)

{
  __type _Var1;
  DummyBinding *this_00;
  optional_ptr<duckdb::Binding,_true> oVar2;
  BindingAlias alias;
  string local_f0;
  string local_d0;
  string local_b0;
  BindingAlias local_90;
  
  if ((this->macro_binding).ptr != (DummyBinding *)0x0) {
    this_00 = optional_ptr<duckdb::DummyBinding,_true>::operator->(&this->macro_binding);
    Binding::GetAlias_abi_cxx11_(&local_90.catalog,&this_00->super_Binding);
    _Var1 = ::std::operator==(table_name,&local_90.catalog);
    ::std::__cxx11::string::~string((string *)&local_90);
    if (_Var1) {
      return (optional_ptr<duckdb::Binding,_true>)&((this->macro_binding).ptr)->super_Binding;
    }
  }
  ::std::__cxx11::string::string((string *)&local_b0,(string *)catalog_name);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)schema_name);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)table_name);
  BindingAlias::BindingAlias(&local_90,&local_b0,&local_d0,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  oVar2 = BindContext::GetBinding(&this->bind_context,&local_90,column_name,error);
  BindingAlias::~BindingAlias(&local_90);
  return (optional_ptr<duckdb::Binding,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<Binding> Binder::GetMatchingBinding(const string &catalog_name, const string &schema_name,
                                                 const string &table_name, const string &column_name,
                                                 ErrorData &error) {
	optional_ptr<Binding> binding;
	D_ASSERT(!lambda_bindings);
	if (macro_binding && table_name == macro_binding->GetAlias()) {
		binding = optional_ptr<Binding>(macro_binding.get());
	} else {
		BindingAlias alias(catalog_name, schema_name, table_name);
		binding = bind_context.GetBinding(alias, column_name, error);
	}
	return binding;
}